

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lutf8lib.c
# Opt level: O0

int iter_aux(lua_State *L,int strict)

{
  char *pcVar1;
  char *next;
  char *pcStack_38;
  l_uint32 code;
  lua_Unsigned n;
  char *s;
  size_t len;
  lua_State *plStack_18;
  int strict_local;
  lua_State *L_local;
  
  len._4_4_ = strict;
  plStack_18 = L;
  n = (lua_Unsigned)luaL_checklstring(L,1,(size_t *)&s);
  pcStack_38 = (char *)lua_tointegerx(plStack_18,2,(int *)0x0);
  if (pcStack_38 < s) {
    while (((int)pcStack_38[n] & 0xc0U) == 0x80) {
      pcStack_38 = pcStack_38 + 1;
    }
  }
  if (pcStack_38 < s) {
    pcVar1 = utf8_decode(pcStack_38 + n,(l_uint32 *)((long)&next + 4),len._4_4_);
    if ((pcVar1 == (char *)0x0) || (((int)*pcVar1 & 0xc0U) == 0x80)) {
      L_local._4_4_ = luaL_error(plStack_18,"invalid UTF-8 code");
    }
    else {
      lua_pushinteger(plStack_18,(lua_Integer)(pcStack_38 + 1));
      lua_pushinteger(plStack_18,(ulong)next._4_4_);
      L_local._4_4_ = 2;
    }
  }
  else {
    L_local._4_4_ = 0;
  }
  return L_local._4_4_;
}

Assistant:

static int iter_aux (lua_State *L, int strict) {
  size_t len;
  const char *s = luaL_checklstring(L, 1, &len);
  lua_Unsigned n = (lua_Unsigned)lua_tointeger(L, 2);
  if (n < len) {
    while (iscontp(s + n)) n++;  /* go to next character */
  }
  if (n >= len)  /* (also handles original 'n' being negative) */
    return 0;  /* no more codepoints */
  else {
    l_uint32 code;
    const char *next = utf8_decode(s + n, &code, strict);
    if (next == NULL || iscontp(next))
      return luaL_error(L, MSGInvalid);
    lua_pushinteger(L, l_castU2S(n + 1));
    lua_pushinteger(L, l_castU2S(code));
    return 2;
  }
}